

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O0

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::const_iterator::operator++(const_iterator *this)

{
  bool bVar1;
  size_t sVar2;
  const_iterator *in_RDI;
  
  sVar2 = in_RDI->pos + 1;
  in_RDI->pos = sVar2;
  if (sVar2 != 0x40) {
    _findClosestBit(in_RDI);
  }
  if (in_RDI->pos == 0x40) {
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
    ::operator++(&in_RDI->container_it);
    in_RDI->pos = 0;
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                       in_RDI,&(in_RDI->container_end).
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      );
    if (bVar1) {
      _findClosestBit(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

const_iterator &operator++() {
            // shift to the next bit in the current bits
            assert(pos < BITS_IN_BUCKET);
            assert(container_it != container_end && "operator++ called on end");
            if (++pos != BITS_IN_BUCKET)
                _findClosestBit();

            if (pos == BITS_IN_BUCKET) {
                ++container_it;
                pos = 0;
                if (container_it != container_end) {
                    assert(container_it->second != 0 &&
                           "Empty bucket in a bitvector");
                    _findClosestBit();
                }
            }
            return *this;
        }